

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stable_partition_suite.cpp
# Opt level: O0

void partition_map_value(void)

{
  type tVar1;
  bool bVar2;
  reference pbVar3;
  basic_variable<std::allocator<char>> *pbVar4;
  const_reference pbVar5;
  size_type in_RCX;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init_00;
  basic_variable<std::allocator<char>_> *local_e68;
  basic_variable<std::allocator<char>_> *local_e50;
  basic_variable<std::allocator<char>_> *local_e38;
  basic_variable<std::allocator<char>_> *local_e20;
  basic_variable<std::allocator<char>_> *local_e08;
  basic_variable<std::allocator<char>_> *local_df0;
  basic_variable<std::allocator<char>_> *local_dd8;
  basic_variable<std::allocator<char>_> *local_dc0;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_da8;
  type *local_d90;
  basic_variable<std::allocator<char>_> *local_d78;
  iterator local_d28;
  iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_d10;
  undefined4 local_cf4;
  iterator local_cf0;
  iterator local_cd8;
  difference_type local_cc0;
  undefined1 local_cb2 [2];
  iterator local_cb0;
  iterator local_c98;
  undefined1 local_c7b [3];
  iterator local_c78;
  iterator local_c60;
  undefined1 local_c48 [8];
  iterator where_6;
  iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_c18;
  undefined4 local_bfc;
  iterator local_bf8;
  iterator local_be0;
  difference_type local_bc8;
  undefined1 local_bba [2];
  iterator local_bb8;
  iterator local_ba0;
  undefined1 local_b83 [3];
  iterator local_b80;
  iterator local_b68;
  undefined1 local_b50 [8];
  iterator where_5;
  undefined4 local_b1c;
  iterator local_b18;
  iterator local_b00;
  difference_type local_ae8;
  undefined1 local_ada [2];
  iterator local_ad8;
  iterator local_ac0;
  undefined1 local_aa3 [3];
  iterator local_aa0;
  iterator local_a88;
  undefined1 local_a70 [8];
  iterator where_4;
  iterator local_a50;
  undefined4 local_a34;
  iterator local_a30;
  iterator local_a18;
  difference_type local_a00;
  undefined1 local_9f2 [2];
  iterator local_9f0;
  iterator local_9d8;
  undefined1 local_9bb [3];
  iterator local_9b8;
  iterator local_9a0;
  undefined1 local_988 [8];
  iterator where_3;
  iterator local_968;
  undefined4 local_94c;
  iterator local_948;
  iterator local_930;
  difference_type local_918;
  undefined1 local_90a [2];
  iterator local_908;
  iterator local_8f0;
  undefined1 local_8d3 [3];
  iterator local_8d0;
  iterator local_8b8;
  undefined1 local_8a0 [8];
  iterator where_2;
  iterator local_880;
  undefined4 local_864;
  iterator local_860;
  iterator local_848;
  difference_type local_830;
  undefined1 local_822 [2];
  iterator local_820;
  iterator local_808;
  undefined1 local_7eb [3];
  iterator local_7e8;
  iterator local_7d0;
  undefined1 local_7b8 [8];
  iterator where_1;
  iterator local_798;
  undefined4 local_77c;
  iterator local_778;
  iterator local_760;
  difference_type local_748;
  undefined1 local_73a [2];
  iterator local_738;
  iterator local_720;
  undefined1 local_703 [3];
  iterator local_700;
  iterator local_6e8;
  undefined1 local_6d0 [8];
  iterator where;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_6a8;
  undefined1 auStack_648 [32];
  basic_variable<std::allocator<char>_> local_628;
  basic_variable<std::allocator<char>_> local_5f8;
  type local_5c8;
  basic_variable<std::allocator<char>_> local_5a8;
  undefined1 auStack_578 [80];
  basic_variable<std::allocator<char>_> local_528;
  undefined1 auStack_4f8 [32];
  basic_variable<std::allocator<char>_> local_4d8;
  basic_variable<std::allocator<char>_> local_4a8;
  undefined1 auStack_478 [32];
  basic_variable<std::allocator<char>_> local_458;
  basic_variable<std::allocator<char>_> local_428;
  undefined1 auStack_3f8 [32];
  basic_variable<std::allocator<char>_> local_3d8;
  basic_variable<std::allocator<char>_> local_3a8;
  undefined1 auStack_378 [32];
  basic_variable<std::allocator<char>_> local_358;
  basic_variable<std::allocator<char>_> local_328;
  undefined1 auStack_2f8 [32];
  basic_variable<std::allocator<char>_> local_2d8;
  basic_variable<std::allocator<char>_> local_2a8;
  undefined1 auStack_278 [24];
  nullable local_260 [4];
  basic_variable<std::allocator<char>_> *local_250;
  basic_variable<std::allocator<char>_> local_248;
  basic_variable<std::allocator<char>_> local_218;
  undefined1 auStack_1e8 [32];
  basic_variable<std::allocator<char>_> local_1c8;
  basic_variable<std::allocator<char>_> local_198;
  basic_variable<std::allocator<char>_> local_168;
  basic_variable<std::allocator<char>_> local_138;
  basic_variable<std::allocator<char>_> local_108;
  basic_variable<std::allocator<char>_> local_d8;
  basic_variable<std::allocator<char>_> local_a8;
  basic_variable<std::allocator<char>_> local_78;
  undefined1 local_48 [24];
  variable data;
  
  where.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._10_1_ = 1;
  auStack_1e8._24_8_ = &local_1c8;
  local_250 = &local_248;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_250,"alpha");
  local_250 = &local_218;
  local_260[0] = null;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_250,local_260);
  auStack_1e8._8_8_ = &local_248;
  auStack_1e8._16_8_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            (&local_1c8,
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)
             (auStack_1e8 + 8));
  auStack_2f8._24_8_ = &local_2d8;
  auStack_1e8._24_8_ = &local_198;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)auStack_2f8._24_8_,"bravo");
  auStack_2f8._24_8_ = &local_2a8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>
            ((basic_variable<std::allocator<char>_> *)auStack_2f8._24_8_,true);
  auStack_278._8_8_ = &local_2d8;
  auStack_278._16_8_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            (&local_198,
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)
             (auStack_278 + 8));
  auStack_378._24_8_ = &local_358;
  auStack_1e8._24_8_ = &local_168;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)auStack_378._24_8_,"charlie");
  auStack_378._24_8_ = &local_328;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>
            ((basic_variable<std::allocator<char>_> *)auStack_378._24_8_,2);
  auStack_2f8._8_8_ = &local_358;
  auStack_2f8._16_8_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            (&local_168,
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)
             (auStack_2f8 + 8));
  auStack_3f8._24_8_ = &local_3d8;
  auStack_1e8._24_8_ = &local_138;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)auStack_3f8._24_8_,"delta");
  auStack_3f8._24_8_ = &local_3a8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>
            ((basic_variable<std::allocator<char>_> *)auStack_3f8._24_8_,3.0);
  auStack_378._8_8_ = &local_3d8;
  auStack_378._16_8_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            (&local_138,
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)
             (auStack_378 + 8));
  auStack_478._24_8_ = &local_458;
  auStack_1e8._24_8_ = &local_108;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)auStack_478._24_8_,"echo");
  auStack_478._24_8_ = &local_428;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)auStack_478._24_8_,"hydrogen");
  auStack_3f8._8_8_ = &local_458;
  auStack_3f8._16_8_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            (&local_108,
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)
             (auStack_3f8 + 8));
  auStack_4f8._24_8_ = &local_4d8;
  auStack_1e8._24_8_ = &local_d8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)auStack_4f8._24_8_,"foxtrot");
  auStack_4f8._24_8_ = &local_4a8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)auStack_4f8._24_8_,L"helium");
  auStack_478._8_8_ = &local_4d8;
  auStack_478._16_8_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            (&local_d8,
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)
             (auStack_478 + 8));
  local_5c8.__data[0x17] = '\x01';
  auStack_578._24_8_ = auStack_578 + 0x20;
  auStack_1e8._24_8_ = &local_a8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)auStack_578._24_8_,"golf");
  local_5c8._24_8_ = &local_5a8;
  auStack_578._24_8_ = &local_528;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>
            ((basic_variable<std::allocator<char>_> *)local_5c8._24_8_,5);
  auStack_578._8_8_ = &local_5a8;
  auStack_578._16_8_ = 1;
  init._M_len = in_RCX;
  init._M_array = (iterator)0x1;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            (&local_528,(basic_array<std::allocator<char>_> *)auStack_578._8_8_,init);
  local_5c8.__data[0x17] = '\0';
  auStack_4f8._8_8_ = auStack_578 + 0x20;
  auStack_4f8._16_8_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            (&local_a8,
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)
             (auStack_4f8 + 8));
  where.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._11_1_ = 1;
  auStack_648._24_8_ = auStack_648 + 0x20;
  auStack_1e8._24_8_ = &local_78;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)auStack_648._24_8_,"hotel");
  where.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._12_4_ = 6;
  auStack_648._24_8_ = (basic_variable<std::allocator<char>_> *)(auStack_648 + 0x50);
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_int,_true>
            (&local_6a8,(char (*) [6])"alice",
             (int *)&where.
                     super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                     .current.field_0xc);
  auStack_648._8_8_ = &local_6a8;
  auStack_648._16_8_ = 1;
  init_00._M_len = in_RCX;
  init_00._M_array = (iterator)0x1;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(auStack_648 + 0x50),
             (basic_map<std::allocator<char>_> *)auStack_648._8_8_,init_00);
  where.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._11_1_ = 0;
  local_5c8._0_8_ = auStack_648 + 0x20;
  local_5c8._8_8_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            (&local_78,
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)
             &local_5c8.__align);
  where.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._10_1_ = 0;
  local_48._0_8_ = &local_1c8;
  local_48._8_8_ = 8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10),
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)local_48);
  local_d78 = (basic_variable<std::allocator<char>_> *)local_48;
  do {
    local_d78 = local_d78 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_d78);
  } while (local_d78 != &local_1c8);
  local_d90 = &local_5c8;
  do {
    local_d90 = (type *)((long)local_d90 + -0x30);
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
              ((basic_variable<std::allocator<char>_> *)&local_d90->__align);
  } while (local_d90 != (type *)(auStack_648 + 0x20));
  local_da8 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
               *)auStack_648;
  do {
    local_da8 = local_da8 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_da8);
  } while (local_da8 != &local_6a8);
  local_dc0 = (basic_variable<std::allocator<char>_> *)auStack_4f8;
  do {
    local_dc0 = local_dc0 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_dc0);
  } while (local_dc0 != (basic_variable<std::allocator<char>_> *)(auStack_578 + 0x20));
  local_dd8 = (basic_variable<std::allocator<char>_> *)auStack_578;
  do {
    local_dd8 = local_dd8 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_dd8);
  } while (local_dd8 != &local_5a8);
  local_df0 = (basic_variable<std::allocator<char>_> *)auStack_478;
  do {
    local_df0 = local_df0 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_df0);
  } while (local_df0 != &local_4d8);
  local_e08 = (basic_variable<std::allocator<char>_> *)auStack_3f8;
  do {
    local_e08 = local_e08 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_e08);
  } while (local_e08 != &local_458);
  local_e20 = (basic_variable<std::allocator<char>_> *)auStack_378;
  do {
    local_e20 = local_e20 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_e20);
  } while (local_e20 != &local_3d8);
  local_e38 = (basic_variable<std::allocator<char>_> *)auStack_2f8;
  do {
    local_e38 = local_e38 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_e38);
  } while (local_e38 != &local_358);
  local_e50 = (basic_variable<std::allocator<char>_> *)auStack_278;
  do {
    local_e50 = local_e50 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_e50);
  } while (local_e50 != &local_2d8);
  local_e68 = (basic_variable<std::allocator<char>_> *)auStack_1e8;
  do {
    local_e68 = local_e68 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_e68);
  } while (local_e68 != &local_248);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_6e8,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_700,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  std::
  stable_partition<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::is<trial::dynamic::nullable>>
            (local_6d0,&local_6e8,&local_700);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_700);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_6e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_720,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_738,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  local_703[0] = std::
                 is_partitioned<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::is<trial::dynamic::nullable>>
                           (&local_720,&local_738);
  local_73a[0] = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("std::is_partitioned(data.begin(), data.end(), is<nullable>())","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/stable_partition_suite.cpp"
             ,0xac,"void partition_map_value()",local_703,local_73a);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_738);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_720);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_760,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_778,(iterator *)local_6d0);
  local_748 = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                        (&local_760,&local_778);
  local_77c = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), where)","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/stable_partition_suite.cpp"
             ,0xad,"void partition_map_value()",&local_748,&local_77c);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_778);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_760);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_798,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  pbVar3 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator*(&local_798);
  where_1.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._12_4_ = 0;
  tVar1 = trial::dynamic::operator==
                    (pbVar3,(nullable *)
                            &where_1.
                             super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                             .current.field_0xc);
  boost::detail::test_impl
            ("*data.begin() == null",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/stable_partition_suite.cpp"
             ,0xae,"void partition_map_value()",tVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_798);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_6d0);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_7d0,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_7e8,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  std::
  stable_partition<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::is<trial::dynamic::boolean>>
            (local_7b8,&local_7d0,&local_7e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_7e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_7d0);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_808,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_820,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  local_7eb[0] = std::
                 is_partitioned<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::is<trial::dynamic::boolean>>
                           (&local_808,&local_820);
  local_822[0] = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("std::is_partitioned(data.begin(), data.end(), is<boolean>())","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/stable_partition_suite.cpp"
             ,0xb2,"void partition_map_value()",local_7eb,local_822);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_820);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_808);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_848,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_860,(iterator *)local_7b8);
  local_830 = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                        (&local_848,&local_860);
  local_864 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), where)","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/stable_partition_suite.cpp"
             ,0xb3,"void partition_map_value()",&local_830,&local_864);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_860);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_848);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_880,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  pbVar3 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator*(&local_880);
  where_2.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._15_1_ = 1;
  tVar1 = trial::dynamic::operator==
                    (pbVar3,(bool *)&where_2.
                                     super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                                     .current.field_0xf);
  boost::detail::test_impl
            ("*data.begin() == true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/stable_partition_suite.cpp"
             ,0xb4,"void partition_map_value()",tVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_880);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_7b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_8b8,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_8d0,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  std::
  stable_partition<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::is<trial::dynamic::integer>>
            (local_8a0,&local_8b8,&local_8d0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_8d0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_8b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_8f0,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_908,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  local_8d3[0] = std::
                 is_partitioned<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::is<trial::dynamic::integer>>
                           (&local_8f0,&local_908);
  local_90a[0] = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("std::is_partitioned(data.begin(), data.end(), is<integer>())","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/stable_partition_suite.cpp"
             ,0xb8,"void partition_map_value()",local_8d3,local_90a);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_908);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_8f0);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_930,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_948,(iterator *)local_8a0);
  local_918 = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                        (&local_930,&local_948);
  local_94c = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), where)","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/stable_partition_suite.cpp"
             ,0xb9,"void partition_map_value()",&local_918,&local_94c);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_948);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_930);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_968,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  pbVar3 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator*(&local_968);
  where_3.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._12_4_ = 2;
  tVar1 = trial::dynamic::operator==
                    (pbVar3,(int *)&where_3.
                                    super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                                    .current.field_0xc);
  boost::detail::test_impl
            ("*data.begin() == 2",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/stable_partition_suite.cpp"
             ,0xba,"void partition_map_value()",tVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_968);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_8a0);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_9a0,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_9b8,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  std::
  stable_partition<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::is<trial::dynamic::real>>
            (local_988,&local_9a0,&local_9b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_9b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_9a0);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_9d8,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_9f0,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  local_9bb[0] = std::
                 is_partitioned<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::is<trial::dynamic::real>>
                           (&local_9d8,&local_9f0);
  local_9f2[0] = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("std::is_partitioned(data.begin(), data.end(), is<real>())","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/stable_partition_suite.cpp"
             ,0xbe,"void partition_map_value()",local_9bb,local_9f2);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_9f0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_9d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_a18,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_a30,(iterator *)local_988);
  local_a00 = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                        (&local_a18,&local_a30);
  local_a34 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), where)","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/stable_partition_suite.cpp"
             ,0xbf,"void partition_map_value()",&local_a00,&local_a34);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_a30);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_a18);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_a50,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  pbVar3 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator*(&local_a50);
  where_4.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current.current = '\0';
  where_4.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._9_7_ = 0x40080000000000;
  tVar1 = trial::dynamic::operator==
                    (pbVar3,(double *)
                            &where_4.
                             super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                             .current.current);
  boost::detail::test_impl
            ("*data.begin() == 3.0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/stable_partition_suite.cpp"
             ,0xc0,"void partition_map_value()",tVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_a50);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_988);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_a88,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_aa0,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  std::
  stable_partition<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::is<trial::dynamic::string>>
            (local_a70,&local_a88,&local_aa0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_aa0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_a88);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_ac0,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_ad8,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  local_aa3[0] = std::
                 is_partitioned<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::is<trial::dynamic::string>>
                           (&local_ac0,&local_ad8);
  local_ada[0] = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("std::is_partitioned(data.begin(), data.end(), is<string>())","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/stable_partition_suite.cpp"
             ,0xc4,"void partition_map_value()",local_aa3,local_ada);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_ad8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_ac0);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_b00,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_b18,(iterator *)local_a70);
  local_ae8 = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                        (&local_b00,&local_b18);
  local_b1c = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), where)","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/stable_partition_suite.cpp"
             ,0xc5,"void partition_map_value()",&local_ae8,&local_b1c);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_b18);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_b00);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            ((iterator *)
             &where_5.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  pbVar3 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator*
                     ((iterator *)
                      &where_5.
                       super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                       .current.current);
  tVar1 = trial::dynamic::operator==(pbVar3,(char (*) [9])"hydrogen");
  boost::detail::test_impl
            ("*data.begin() == \"hydrogen\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/stable_partition_suite.cpp"
             ,0xc6,"void partition_map_value()",tVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator
            ((iterator *)
             &where_5.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_a70);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_b68,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_b80,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  std::
  stable_partition<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::is<trial::dynamic::basic_array<std::allocator<char>>>>
            (local_b50,&local_b68,&local_b80);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_b80);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_b68);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_ba0,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_bb8,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  local_b83[0] = std::
                 is_partitioned<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::is<trial::dynamic::basic_array<std::allocator<char>>>>
                           (&local_ba0,&local_bb8);
  local_bba[0] = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("std::is_partitioned(data.begin(), data.end(), is<array>())","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/stable_partition_suite.cpp"
             ,0xca,"void partition_map_value()",local_b83,local_bba);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_bb8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_ba0);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_be0,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_bf8,(iterator *)local_b50);
  local_bc8 = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                        (&local_be0,&local_bf8);
  local_bfc = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), where)","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/stable_partition_suite.cpp"
             ,0xcb,"void partition_map_value()",&local_bc8,&local_bfc);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_bf8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_be0);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            ((iterator *)&local_c18,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  pbVar4 = (basic_variable<std::allocator<char>> *)
           trial::dynamic::basic_variable<std::allocator<char>_>::
           iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
           ::operator->(&local_c18);
  bVar2 = trial::dynamic::basic_variable<std::allocator<char>>::
          is<trial::dynamic::basic_array<std::allocator<char>>>(pbVar4);
  boost::detail::test_impl
            ("data.begin()->is<array>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/stable_partition_suite.cpp"
             ,0xcc,"void partition_map_value()",bVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)&local_c18)
  ;
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            ((iterator *)
             &where_6.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  pbVar5 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::key
                     ((iterator *)
                      &where_6.
                       super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                       .current.current);
  tVar1 = trial::dynamic::operator==(pbVar5,(char (*) [6])"alpha");
  boost::detail::test_impl
            ("data.begin().key() == \"alpha\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/stable_partition_suite.cpp"
             ,0xcd,"void partition_map_value()",tVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator
            ((iterator *)
             &where_6.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_b50);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_c60,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_c78,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  std::
  stable_partition<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::is<trial::dynamic::basic_map<std::allocator<char>>>>
            (local_c48,&local_c60,&local_c78);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_c78);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_c60);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_c98,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_cb0,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  local_c7b[0] = std::
                 is_partitioned<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::is<trial::dynamic::basic_map<std::allocator<char>>>>
                           (&local_c98,&local_cb0);
  local_cb2[0] = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("std::is_partitioned(data.begin(), data.end(), is<map>())","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/stable_partition_suite.cpp"
             ,0xd1,"void partition_map_value()",local_c7b,local_cb2);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_cb0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_c98);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_cd8,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_cf0,(iterator *)local_c48);
  local_cc0 = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                        (&local_cd8,&local_cf0);
  local_cf4 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), where)","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/stable_partition_suite.cpp"
             ,0xd2,"void partition_map_value()",&local_cc0,&local_cf4);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_cf0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_cd8);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            ((iterator *)&local_d10,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  pbVar4 = (basic_variable<std::allocator<char>> *)
           trial::dynamic::basic_variable<std::allocator<char>_>::
           iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
           ::operator->(&local_d10);
  bVar2 = trial::dynamic::basic_variable<std::allocator<char>>::
          is<trial::dynamic::basic_map<std::allocator<char>>>(pbVar4);
  boost::detail::test_impl
            ("data.begin()->is<map>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/stable_partition_suite.cpp"
             ,0xd3,"void partition_map_value()",bVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)&local_d10)
  ;
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_d28,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  pbVar5 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::key(&local_d28);
  tVar1 = trial::dynamic::operator==(pbVar5,(char (*) [6])"alpha");
  boost::detail::test_impl
            ("data.begin().key() == \"alpha\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/stable_partition_suite.cpp"
             ,0xd4,"void partition_map_value()",tVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_d28);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_c48);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  return;
}

Assistant:

void partition_map_value()
{
    variable data =
        {
            { "alpha", null },
            { "bravo", true },
            { "charlie", 2 },
            { "delta", 3.0 },
            { "echo", "hydrogen" },
            { "foxtrot", L"helium" },
            { "golf", array::make({ 5 }) },
            { "hotel", map::make({ {"alice", 6} }) }
        };
    {
        auto where = std::stable_partition(data.begin(), data.end(), is<nullable>());
        TRIAL_PROTOCOL_TEST_EQUAL(std::is_partitioned(data.begin(), data.end(), is<nullable>()), true);
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), where), 1);
        TRIAL_PROTOCOL_TEST(*data.begin() == null);
    }
    {
        auto where = std::stable_partition(data.begin(), data.end(), is<boolean>());
        TRIAL_PROTOCOL_TEST_EQUAL(std::is_partitioned(data.begin(), data.end(), is<boolean>()), true);
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), where), 1);
        TRIAL_PROTOCOL_TEST(*data.begin() == true);
    }
    {
        auto where = std::stable_partition(data.begin(), data.end(), is<integer>());
        TRIAL_PROTOCOL_TEST_EQUAL(std::is_partitioned(data.begin(), data.end(), is<integer>()), true);
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), where), 1);
        TRIAL_PROTOCOL_TEST(*data.begin() == 2);
    }
    {
        auto where = std::stable_partition(data.begin(), data.end(), is<real>());
        TRIAL_PROTOCOL_TEST_EQUAL(std::is_partitioned(data.begin(), data.end(), is<real>()), true);
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), where), 1);
        TRIAL_PROTOCOL_TEST(*data.begin() == 3.0);
    }
    {
        auto where = std::stable_partition(data.begin(), data.end(), is<string>());
        TRIAL_PROTOCOL_TEST_EQUAL(std::is_partitioned(data.begin(), data.end(), is<string>()), true);
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), where), 1);
        TRIAL_PROTOCOL_TEST(*data.begin() == "hydrogen");
    }
    {
        auto where = std::stable_partition(data.begin(), data.end(), is<array>());
        TRIAL_PROTOCOL_TEST_EQUAL(std::is_partitioned(data.begin(), data.end(), is<array>()), true);
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), where), 1);
        TRIAL_PROTOCOL_TEST(data.begin()->is<array>());
        TRIAL_PROTOCOL_TEST(data.begin().key() == "alpha");
    }
    {
        auto where = std::stable_partition(data.begin(), data.end(), is<map>());
        TRIAL_PROTOCOL_TEST_EQUAL(std::is_partitioned(data.begin(), data.end(), is<map>()), true);
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), where), 1);
        TRIAL_PROTOCOL_TEST(data.begin()->is<map>());
        TRIAL_PROTOCOL_TEST(data.begin().key() == "alpha");
    }
}